

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O1

void __thiscall Block::move(Block *this,int direction)

{
  char *errorMessage;
  int *piVar1;
  int iVar2;
  
  if (this->direction == 0) {
    if (direction == 1) {
      piVar1 = &this->column;
      iVar2 = 1;
      if (this->length + this->column != 6) goto LAB_001076c8;
      errorMessage = "Block cannot move RIGHT.";
      iVar2 = 1;
    }
    else {
      if (direction != 0) {
        return;
      }
      piVar1 = &this->column;
      iVar2 = -1;
      if (this->column != 0) goto LAB_001076c8;
      errorMessage = "Block cannot move LEFT.";
      iVar2 = -1;
    }
  }
  else if (direction == 3) {
    piVar1 = &this->row;
    iVar2 = 1;
    if (this->row != 5) goto LAB_001076c8;
    errorMessage = "Block cannot move down.";
    iVar2 = 1;
  }
  else {
    if (direction != 2) {
      return;
    }
    piVar1 = &this->row;
    iVar2 = -1;
    if (this->row - this->length != -1) goto LAB_001076c8;
    errorMessage = "Block cannot move up.";
    iVar2 = -1;
  }
  throwError(errorMessage,this->id);
LAB_001076c8:
  *piVar1 = *piVar1 + iVar2;
  return;
}

Assistant:

bool Block::isHorizontal() {
    return this->direction == HORIZONTAL;
}